

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_util.h
# Opt level: O3

FILE * OpenFileOrDie(char *filename,char *mode)

{
  FILE *pFVar1;
  ostream *poVar2;
  size_t sVar3;
  Logger local_74;
  string local_70;
  string local_50;
  
  if (filename == (char *)0x0) {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    local_74.severity_ = ERR;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/base/file_util.h"
               ,"");
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"OpenFileOrDie","");
    poVar2 = Logger::Start(ERR,&local_50,0x89,&local_70);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"CHECK failed ",0xd);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/base/file_util.h"
               ,0x5d);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,":",1);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x89);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"filename",8);
    std::operator<<(poVar2," == NULL \n");
  }
  else {
    if (mode != (char *)0x0) {
      pFVar1 = fopen(filename,mode);
      if (pFVar1 == (FILE *)0x0) {
        local_74.severity_ = FATAL;
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_50,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/base/file_util.h"
                   ,"");
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"OpenFileOrDie","");
        poVar2 = Logger::Start(FATAL,&local_50,0x8d,&local_70);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,"Cannot open file: ",0x12);
        sVar3 = strlen(filename);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,filename,sVar3);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2," with mode: ",0xc);
        sVar3 = strlen(mode);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,mode,sVar3);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
        Logger::~Logger(&local_74);
      }
      return (FILE *)pFVar1;
    }
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    local_74.severity_ = ERR;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/base/file_util.h"
               ,"");
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"OpenFileOrDie","");
    poVar2 = Logger::Start(ERR,&local_50,0x8a,&local_70);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"CHECK failed ",0xd);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/base/file_util.h"
               ,0x5d);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,":",1);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x8a);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"mode",4);
    std::operator<<(poVar2," == NULL \n");
  }
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  Logger::~Logger(&local_74);
  abort();
}

Assistant:

inline FILE *OpenFileOrDie(const char *filename, const char *mode) {
  CHECK_NOTNULL(filename);
  CHECK_NOTNULL(mode);
  FILE *input_stream = fopen(filename, mode);
  if (input_stream == nullptr) {
    LOG(FATAL) << "Cannot open file: " << filename
               << " with mode: " << mode;
  }  
  return input_stream;
}